

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int p_col;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  pointer pnVar14;
  long lVar15;
  int *piVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int *piVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  piVar6 = (this->row).orig;
  piVar7 = (this->row).perm;
  piVar8 = (this->temp).s_mark;
  lVar20 = 0;
  do {
    if ((this->temp).stage <= lVar20) {
      return;
    }
    iVar2 = piVar6[lVar20];
    piVar9 = (this->u).row.idx;
    iVar3 = (this->u).row.start[iVar2];
    uVar4 = (this->u).row.len[iVar2];
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    piVar18 = piVar9;
    for (uVar27 = 0; uVar27 != uVar4; uVar27 = uVar27 + 1) {
      p_col = piVar9[(long)iVar3 + uVar27];
      piVar10 = (this->u).col.idx;
      piVar11 = (this->u).col.start;
      piVar12 = (this->u).col.len;
      piVar13 = (this->temp).s_cact;
      iVar22 = (piVar12[p_col] + piVar11[p_col]) - piVar13[p_col];
      piVar16 = piVar10 + iVar22;
      do {
        piVar23 = piVar16;
        piVar16 = piVar23 + 1;
      } while (*piVar23 != iVar2);
      *piVar23 = piVar10[iVar22];
      piVar10[iVar22] = iVar2;
      iVar22 = piVar13[p_col];
      piVar13[p_col] = iVar22 + -1;
      if (iVar22 == 2) {
        iVar22 = piVar12[p_col];
        piVar12[p_col] = iVar22 + -1;
        iVar22 = piVar10[(long)piVar11[p_col] + (long)iVar22 + -1];
        if (-1 < piVar7[iVar22]) goto LAB_0024f50e;
        piVar10 = (this->u).row.len;
        iVar21 = piVar10[iVar22] + -1;
        iVar5 = (this->u).row.start[iVar22];
        piVar10[iVar22] = iVar21;
        lVar19 = (long)(iVar5 + iVar21);
        lVar17 = lVar19 * 0x38 + 0x38;
        lVar25 = lVar19 * 4 + 4;
        do {
          lVar24 = lVar17;
          lVar26 = lVar25 + -4;
          lVar15 = lVar25 + -4;
          lVar17 = lVar24 + -0x38;
          lVar25 = lVar26;
        } while (*(int *)((long)piVar18 + lVar15) != p_col);
        pnVar14 = (this->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_68.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar24 + 0x20);
        puVar1 = (uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar24);
        local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar24 + 0x10);
        local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_68.m_backend.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar24);
        local_68.m_backend.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + 4U + lVar24);
        local_68.m_backend._48_8_ =
             *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + 8U + lVar24);
        setPivot(this,(this->temp).stage,p_col,iVar22,&local_68);
        iVar22 = (this->temp).stage;
        (this->temp).stage = iVar22 + 1;
        piVar8[iVar22] = p_col;
        pnVar14 = (this->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)pnVar14[-1].m_backend.data._M_elems + lVar24),&pnVar14[lVar19].m_backend);
        piVar18 = (this->u).row.idx;
        *(int *)((long)piVar18 + lVar26) = piVar18[lVar19];
      }
      else if (iVar22 == 1) {
LAB_0024f50e:
        this->stat = SINGULAR;
        return;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}